

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  undefined8 *puVar1;
  int depth;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  long lVar2;
  stbi__context *psVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  stbi_uc sVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  stbi_uc **ppsVar17;
  stbi_uc *psVar18;
  byte *pbVar19;
  size_t sVar20;
  int *piVar21;
  char *pcVar22;
  ulong uVar23;
  stbi_uc *psVar24;
  uint uVar25;
  long lVar26;
  uint color;
  long lVar27;
  uint uVar28;
  long lVar29;
  stbi__uint32 raw_len_00;
  stbi_uc *psVar30;
  ulong uVar31;
  int iVar32;
  long *in_FS_OFFSET;
  int local_534;
  stbi_uc tc [3];
  ulong local_4e0;
  stbi__uint32 raw_len;
  ulong local_4c8;
  stbi_uc *local_4c0;
  stbi_uc *local_4b8;
  ulong local_4b0;
  stbi_uc *local_4a8;
  stbi__context *local_4a0;
  size_t local_498;
  int local_490;
  int local_48c;
  stbi__uint32 local_488;
  int local_484;
  ulong local_480;
  long local_478;
  size_t local_470;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar12 = stbi__check_png_header(s);
  if (iVar12 == 0) {
    local_534 = 0;
  }
  else {
    local_534 = 1;
    if (scan != 1) {
      ppsVar17 = &z->idata;
      lVar2 = *in_FS_OFFSET;
      puVar1 = (undefined8 *)(lVar2 + -0x20);
      bVar6 = true;
      local_480 = 0;
      color = 0;
      bVar7 = false;
      local_4e0 = 0;
      local_470 = 0;
      local_4c8 = 0;
      bVar8 = false;
      bVar9 = 0;
      do {
        iVar12 = stbi__get16be(s);
        uVar13 = stbi__get16be(s);
        uVar16 = iVar12 * 0x10000 + uVar13;
        uVar14 = stbi__get16be(s);
        uVar15 = stbi__get16be(s);
        uVar25 = uVar14 << 0x10 | uVar15;
        if ((int)uVar25 < 0x49484452) {
          if (uVar25 == 0x43674249) {
            bVar7 = true;
LAB_0013c972:
            stbi__skip(s,uVar16);
LAB_0013cc17:
            stbi__get16be(s);
            stbi__get16be(s);
            bVar5 = true;
          }
          else {
            iVar12 = (int)local_4c8;
            if (uVar25 == 0x49444154) {
              if (!bVar6) {
                if ((bVar9 != 0) && ((uint)local_4e0 == 0)) {
                  *puVar1 = "no PLTE";
                  bVar6 = false;
                  local_4e0 = 0;
                  goto LAB_0013cc44;
                }
                if (scan == 2) {
                  if (bVar9 != 0) {
                    s->img_n = (uint)bVar9;
                  }
LAB_0013cc9f:
                  local_534 = 1;
                  bVar6 = false;
                  goto LAB_0013cca7;
                }
                if (0x40000000 < uVar16) {
                  pcVar22 = "IDAT size limit";
                  goto LAB_0013cc37;
                }
                uVar13 = uVar16 + iVar12;
                if (iVar12 <= (int)uVar13) {
                  if ((uint)local_470 < uVar13) {
                    sVar20 = 0x1000;
                    if (0x1000 < uVar16) {
                      sVar20 = (ulong)uVar16;
                    }
                    if ((uint)local_470 != 0) {
                      sVar20 = local_470 & 0xffffffff;
                    }
                    do {
                      local_470 = sVar20;
                      sVar20 = (ulong)((uint)local_470 * 2);
                    } while ((uint)local_470 < uVar13);
                    psVar18 = (stbi_uc *)realloc(*ppsVar17,local_470);
                    if (psVar18 == (stbi_uc *)0x0) {
                      *puVar1 = "outofmem";
                      bVar6 = false;
                      goto LAB_0013ca9b;
                    }
                    *ppsVar17 = psVar18;
                  }
                  iVar12 = stbi__getn(s,*ppsVar17 + (local_4c8 & 0xffffffff),uVar16);
                  if (iVar12 != 0) {
                    local_4c8 = (ulong)uVar13;
                    bVar11 = bVar9;
LAB_0013d688:
                    bVar9 = bVar11;
                    bVar6 = false;
                    goto LAB_0013cc17;
                  }
                  pcVar22 = "outofdata";
                  goto LAB_0013ca86;
                }
LAB_0013ca91:
                bVar6 = false;
                goto LAB_0013ca9b;
              }
            }
            else {
              if (uVar25 == 0x49454e44) {
                if (bVar6) {
                  pcVar22 = "first not IHDR";
LAB_0013c8be:
                  *puVar1 = pcVar22;
                  local_534 = 0;
                }
                else if (scan == 0) {
                  if (*ppsVar17 == (stbi_uc *)0x0) {
                    pcVar22 = "no IDAT";
                    goto LAB_0013c8be;
                  }
                  raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
                  psVar18 = (stbi_uc *)
                            stbi_zlib_decode_malloc_guesssize_headerflag
                                      ((char *)*ppsVar17,iVar12,raw_len,(int *)&raw_len,(uint)!bVar7
                                      );
                  z->expanded = psVar18;
                  local_534 = 0;
                  if (psVar18 != (stbi_uc *)0x0) {
                    free(*ppsVar17);
                    raw_len_00 = raw_len;
                    *ppsVar17 = (stbi_uc *)0x0;
                    iVar12 = s->img_n + 1;
                    if (bVar8 || (bVar9 == 0 && req_comp != 3) && iVar12 == req_comp) {
                      s->img_out_n = iVar12;
                    }
                    else {
                      s->img_out_n = s->img_n;
                    }
                    psVar18 = z->expanded;
                    iVar12 = s->img_out_n;
                    depth = z->depth;
                    iVar32 = iVar12 << (depth == 0x10);
                    x = z->s->img_x;
                    y = z->s->img_y;
                    if ((int)local_480 == 0) {
                      iVar12 = stbi__create_png_image_raw(z,psVar18,raw_len,iVar12,x,y,depth,color);
                      if (iVar12 != 0) goto LAB_0013d2d6;
                    }
                    else {
                      local_4c0 = (stbi_uc *)stbi__malloc_mad3(x,y,iVar32,0);
                      if (local_4c0 != (stbi_uc *)0x0) {
                        local_498 = (size_t)iVar32;
                        lVar26 = 0;
                        local_490 = iVar32;
                        local_48c = iVar12;
                        do {
                          psVar3 = z->s;
                          local_4b8 = (stbi_uc *)(long)(int)(&DAT_00239fa0)[lVar26];
                          uVar16 = (&DAT_00239fe0)[lVar26];
                          uVar25 = ~(&DAT_00239fa0)[lVar26] + psVar3->img_x + uVar16;
                          uVar14 = uVar25 / uVar16;
                          uVar13 = (&DAT_0023a000)[lVar26];
                          uVar28 = ~(&DAT_00239fc0)[lVar26] + psVar3->img_y + uVar13;
                          uVar15 = uVar28 / uVar13;
                          bVar5 = true;
                          if ((uVar16 <= uVar25) && (uVar13 <= uVar28)) {
                            local_4a0 = (stbi__context *)
                                        CONCAT44(local_4a0._4_4_,(&DAT_00239fc0)[lVar26]);
                            local_484 = uVar14 * depth * psVar3->img_n;
                            local_4a8 = (stbi_uc *)(long)(int)uVar16;
                            local_478 = lVar26;
                            iVar32 = stbi__create_png_image_raw
                                               (z,psVar18,raw_len_00,iVar12,uVar14,uVar15,depth,
                                                color);
                            if (iVar32 == 0) {
                              free(local_4c0);
                              bVar5 = false;
                              lVar26 = local_478;
                            }
                            else {
                              local_488 = raw_len_00;
                              if (0 < (int)uVar15) {
                                iVar32 = (int)local_4a0 * local_490;
                                iVar12 = uVar13 * local_490;
                                local_4b8 = local_4c0 + (long)local_4b8 * local_498;
                                lVar26 = (long)local_4a8 * local_498;
                                local_4b0 = 0;
                                sVar20 = local_498;
                                do {
                                  if (0 < (int)uVar14) {
                                    local_4a0 = z->s;
                                    local_4a8 = z->out;
                                    lVar29 = local_4b0 * (long)(int)uVar14;
                                    lVar27 = 0;
                                    psVar30 = local_4b8;
                                    do {
                                      memcpy(psVar30 + local_4a0->img_x * iVar32,
                                             local_4a8 + (lVar29 + lVar27) * sVar20,local_498);
                                      lVar27 = lVar27 + 1;
                                      psVar30 = psVar30 + lVar26;
                                      sVar20 = local_498;
                                    } while (lVar27 < (int)uVar14);
                                  }
                                  local_4b0 = local_4b0 + 1;
                                  iVar32 = iVar32 + iVar12;
                                } while (local_4b0 < uVar15);
                              }
                              uVar15 = ((local_484 + 7 >> 3) + 1) * uVar15;
                              free(z->out);
                              psVar18 = psVar18 + uVar15;
                              raw_len_00 = local_488 - uVar15;
                              bVar5 = true;
                              lVar26 = local_478;
                              iVar12 = local_48c;
                            }
                          }
                          if (!bVar5) goto LAB_0013cca7;
                          lVar26 = lVar26 + 1;
                        } while (lVar26 != 7);
                        z->out = local_4c0;
LAB_0013d2d6:
                        if (bVar8) {
                          if (z->depth == 0x10) {
                            stbi__compute_transparency16(z,tc16,s->img_out_n);
                          }
                          else {
                            stbi__compute_transparency(z,tc,s->img_out_n);
                          }
                        }
                        if (bVar7) {
                          piVar21 = (int *)(lVar2 + -8);
                          if (*(int *)(lVar2 + -4) == 0) {
                            piVar21 = &stbi__de_iphone_flag_global;
                          }
                          if ((*piVar21 != 0) && (2 < s->img_out_n)) {
                            stbi__de_iphone(z);
                          }
                        }
                        if (bVar9 == 0) {
                          if (bVar8) {
                            s->img_n = s->img_n + 1;
                          }
                        }
                        else {
                          s->img_n = (uint)bVar9;
                          uVar16 = (uint)bVar9;
                          if (2 < req_comp) {
                            uVar16 = req_comp;
                          }
                          s->img_out_n = uVar16;
                          psVar18 = z->out;
                          uVar13 = z->s->img_y * z->s->img_x;
                          psVar30 = (stbi_uc *)stbi__malloc_mad2(uVar13,uVar16,0);
                          if (psVar30 == (stbi_uc *)0x0) {
                            *puVar1 = "outofmem";
                          }
                          else {
                            if (uVar16 == 3) {
                              if (uVar13 != 0) {
                                uVar23 = 0;
                                psVar24 = psVar30;
                                do {
                                  uVar31 = (ulong)psVar18[uVar23];
                                  *psVar24 = palette[uVar31 * 4];
                                  psVar24[1] = palette[uVar31 * 4 + 1];
                                  psVar24[2] = palette[uVar31 * 4 + 2];
                                  psVar24 = psVar24 + 3;
                                  uVar23 = uVar23 + 1;
                                } while (uVar13 != uVar23);
                              }
                            }
                            else if (uVar13 != 0) {
                              uVar23 = 0;
                              do {
                                *(undefined4 *)(psVar30 + uVar23 * 4) =
                                     *(undefined4 *)(palette + (ulong)psVar18[uVar23] * 4);
                                uVar23 = uVar23 + 1;
                              } while (uVar13 != uVar23);
                            }
                            free(psVar18);
                            z->out = psVar30;
                          }
                          if (psVar30 == (stbi_uc *)0x0) goto LAB_0013cca7;
                        }
                        free(z->expanded);
                        z->expanded = (stbi_uc *)0x0;
                        stbi__get16be(s);
                        stbi__get16be(s);
                        goto LAB_0013cab0;
                      }
                      *puVar1 = "outofmem";
                    }
                  }
                }
                else {
LAB_0013cab0:
                  local_534 = 1;
                }
LAB_0013cca7:
                bVar5 = false;
                goto LAB_0013cca9;
              }
LAB_0013c9ab:
              if (!bVar6) {
                bVar6 = false;
                if ((uVar14 >> 0xd & 1) == 0) {
                  stbi__parse_png_file::invalid_chunk[0] = (char)(uVar25 >> 0x18);
                  stbi__parse_png_file::invalid_chunk[1] = (char)(uVar25 >> 0x10);
                  stbi__parse_png_file::invalid_chunk[2] = (char)(uVar15 >> 8);
                  stbi__parse_png_file::invalid_chunk[3] = (char)uVar15;
                  pcVar22 = stbi__parse_png_file::invalid_chunk;
                  goto LAB_0013cc37;
                }
                goto LAB_0013c972;
              }
            }
LAB_0013ca4d:
            *puVar1 = "first not IHDR";
            bVar6 = true;
LAB_0013cc44:
            bVar5 = false;
            local_534 = 0;
          }
        }
        else {
          if (uVar25 == 0x74524e53) {
            if (!bVar6) {
              if (*ppsVar17 != (stbi_uc *)0x0) {
                pcVar22 = "tRNS after IDAT";
LAB_0013ca86:
                *puVar1 = pcVar22;
                goto LAB_0013ca91;
              }
              if (bVar9 == 0) {
                uVar13 = s->img_n;
                if ((uVar13 & 1) == 0) {
                  pcVar22 = "tRNS with alpha";
                }
                else {
                  if (uVar13 * 2 == uVar16) {
                    if (scan != 2) {
                      bVar8 = true;
                      if (z->depth == 0x10) {
                        if (0 < s->img_n) {
                          uVar23 = 0;
                          do {
                            iVar12 = stbi__get16be(s);
                            tc16[uVar23] = (stbi__uint16)iVar12;
                            if (1 < uVar23) break;
                            uVar23 = uVar23 + 1;
                          } while ((long)uVar23 < (long)s->img_n);
                        }
                      }
                      else if (0 < s->img_n) {
                        uVar23 = 0;
                        do {
                          iVar12 = stbi__get16be(s);
                          tc[uVar23] = ""[z->depth] * (char)iVar12;
                          if (1 < uVar23) break;
                          uVar23 = uVar23 + 1;
                        } while ((long)uVar23 < (long)s->img_n);
                      }
                      bVar6 = false;
                      bVar9 = 0;
                      goto LAB_0013cc17;
                    }
                    s->img_n = uVar13 + 1;
                    local_534 = 1;
                    bVar8 = true;
                    bVar6 = false;
                    bVar5 = false;
                    bVar9 = 0;
                    goto LAB_0013cca9;
                  }
                  pcVar22 = "bad tRNS len";
                }
                *puVar1 = pcVar22;
                bVar6 = false;
                bVar9 = 0;
                goto LAB_0013cc44;
              }
              if (scan == 2) {
                s->img_n = 4;
                goto LAB_0013cc9f;
              }
              if ((uint)local_4e0 == 0) {
                *puVar1 = "tRNS before PLTE";
                bVar6 = false;
                local_4e0 = 0;
                goto LAB_0013ca9b;
              }
              if ((uint)local_4e0 < uVar16) {
                pcVar22 = "bad tRNS len";
                goto LAB_0013ca86;
              }
              bVar9 = 4;
              bVar6 = false;
              bVar11 = 4;
              if (uVar16 == 0) goto LAB_0013d688;
              uVar23 = 0;
              do {
                psVar18 = s->img_buffer;
                if (psVar18 < s->img_buffer_end) {
LAB_0013d3e2:
                  s->img_buffer = psVar18 + 1;
                  sVar10 = *psVar18;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar18 = s->img_buffer;
                    goto LAB_0013d3e2;
                  }
                  sVar10 = '\0';
                }
                palette[uVar23 * 4 + 3] = sVar10;
                uVar23 = uVar23 + 1;
              } while (uVar13 + iVar12 * 0x10000 != uVar23);
              goto LAB_0013cc17;
            }
            *puVar1 = "first not IHDR";
            bVar6 = true;
LAB_0013ca9b:
            local_534 = 0;
            bVar5 = false;
            goto LAB_0013cca9;
          }
          if (uVar25 == 0x504c5445) {
            if (bVar6) goto LAB_0013ca4d;
            if (uVar16 < 0x301) {
              uVar23 = (ulong)uVar13 * 0x55555556;
              local_4e0 = uVar23 >> 0x20;
              if ((int)(uVar23 >> 0x20) * 3 == uVar16) {
                bVar6 = false;
                if (2 < uVar13) {
                  uVar31 = 0;
                  do {
                    psVar18 = s->img_buffer;
                    if (psVar18 < s->img_buffer_end) {
LAB_0013cb3a:
                      s->img_buffer = psVar18 + 1;
                      sVar10 = *psVar18;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar18 = s->img_buffer;
                        goto LAB_0013cb3a;
                      }
                      sVar10 = '\0';
                    }
                    palette[uVar31 * 4] = sVar10;
                    psVar18 = s->img_buffer;
                    if (psVar18 < s->img_buffer_end) {
LAB_0013cb74:
                      s->img_buffer = psVar18 + 1;
                      sVar10 = *psVar18;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar18 = s->img_buffer;
                        goto LAB_0013cb74;
                      }
                      sVar10 = '\0';
                    }
                    palette[uVar31 * 4 + 1] = sVar10;
                    psVar18 = s->img_buffer;
                    if (psVar18 < s->img_buffer_end) {
LAB_0013cbae:
                      s->img_buffer = psVar18 + 1;
                      sVar10 = *psVar18;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar18 = s->img_buffer;
                        goto LAB_0013cbae;
                      }
                      sVar10 = '\0';
                    }
                    palette[uVar31 * 4 + 2] = sVar10;
                    palette[uVar31 * 4 + 3] = 0xff;
                    uVar31 = uVar31 + 1;
                  } while (uVar23 >> 0x20 != uVar31);
                }
                goto LAB_0013cc17;
              }
            }
            pcVar22 = "invalid PLTE";
LAB_0013cc37:
            *puVar1 = pcVar22;
            bVar6 = false;
            goto LAB_0013cc44;
          }
          if (uVar25 != 0x49484452) goto LAB_0013c9ab;
          if (bVar6) {
            if (uVar16 != 0xd) {
              pcVar22 = "bad IHDR len";
              goto LAB_0013cbf5;
            }
            iVar12 = stbi__get16be(s);
            uVar16 = stbi__get16be(s);
            s->img_x = uVar16 | iVar12 << 0x10;
            iVar12 = stbi__get16be(s);
            uVar16 = stbi__get16be(s);
            uVar16 = uVar16 | iVar12 << 0x10;
            s->img_y = uVar16;
            if ((0x1000000 < uVar16) || (0x1000000 < s->img_x)) {
              pcVar22 = "too large";
              goto LAB_0013cbf5;
            }
            pbVar19 = s->img_buffer;
            if (pbVar19 < s->img_buffer_end) {
LAB_0013cdb5:
              s->img_buffer = pbVar19 + 1;
              bVar11 = *pbVar19;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar19 = s->img_buffer;
                goto LAB_0013cdb5;
              }
              bVar11 = 0;
            }
            z->depth = (uint)bVar11;
            if ((0x10 < bVar11) || ((0x10116U >> (bVar11 & 0x1f) & 1) == 0)) {
              pcVar22 = "1/2/4/8/16-bit only";
              goto LAB_0013cbf5;
            }
            pbVar19 = s->img_buffer;
            if (pbVar19 < s->img_buffer_end) {
LAB_0013ce0c:
              s->img_buffer = pbVar19 + 1;
              color = (uint)*pbVar19;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar19 = s->img_buffer;
                goto LAB_0013ce0c;
              }
              color = 0;
            }
            if ((byte)color < 7) {
              if (color != 3) {
                bVar11 = bVar9;
                if ((color & 1) == 0) goto LAB_0013d33c;
                goto LAB_0013ce27;
              }
              bVar11 = 3;
              if (z->depth == 0x10) {
                *puVar1 = "bad ctype";
                color = 3;
                goto LAB_0013ce3d;
              }
LAB_0013d33c:
              bVar9 = bVar11;
              psVar18 = s->img_buffer;
              if (psVar18 < s->img_buffer_end) {
LAB_0013d370:
                s->img_buffer = psVar18 + 1;
                if (*psVar18 == '\0') goto LAB_0013d459;
                pcVar22 = "bad comp method";
LAB_0013d793:
                *puVar1 = pcVar22;
                bVar4 = false;
                local_534 = 0;
                goto LAB_0013cc02;
              }
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                psVar18 = s->img_buffer;
                goto LAB_0013d370;
              }
LAB_0013d459:
              sVar10 = stbi__get8(s);
              if (sVar10 != '\0') {
                pcVar22 = "bad filter method";
                goto LAB_0013d793;
              }
              bVar11 = stbi__get8(s);
              local_480 = (ulong)bVar11;
              if (1 < bVar11) {
                pcVar22 = "bad interlace method";
                goto LAB_0013d793;
              }
              uVar16 = s->img_x;
              if ((uVar16 == 0) || (uVar13 = s->img_y, uVar13 == 0)) {
                pcVar22 = "0-pixel image";
                goto LAB_0013d793;
              }
              if (bVar9 != 0) {
                s->img_n = 1;
                if ((uint)(0x40000000 / (ulong)uVar16 >> 2) < uVar13) {
                  *puVar1 = "too large";
                  goto LAB_0013cbfa;
                }
LAB_0013d7fc:
                bVar4 = true;
                goto LAB_0013cc02;
              }
              uVar14 = (3 < (byte)color) + 1 + (color & 2);
              s->img_n = uVar14;
              if (uVar13 <= (uint)((0x40000000 / (ulong)uVar16) / (ulong)uVar14)) goto LAB_0013d7fc;
              *puVar1 = "too large";
              bVar9 = 0;
              goto LAB_0013cbfa;
            }
LAB_0013ce27:
            *puVar1 = "bad ctype";
LAB_0013ce3d:
            bVar4 = false;
            local_534 = 0;
          }
          else {
            pcVar22 = "multiple IHDR";
LAB_0013cbf5:
            *puVar1 = pcVar22;
LAB_0013cbfa:
            bVar4 = false;
            local_534 = 0;
          }
LAB_0013cc02:
          bVar6 = false;
          bVar5 = false;
          if (bVar4) goto LAB_0013cc17;
        }
LAB_0013cca9:
      } while (bVar5);
    }
  }
  return local_534;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
            }
            // even with SCAN_header, have to scan to see if we have a tRNS
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               // non-paletted with tRNS = constant alpha. if header-scanning, we can stop now.
               if (scan == STBI__SCAN_header) { ++s->img_n; return 1; }
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n && k < 3; ++k) // extra loop test to suppress false GCC warning
                     tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n && k < 3; ++k)
                     tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) {
               // header scan definitely stops at first IDAT
               if (pal_img_n)
                  s->img_n = pal_img_n;
               return 1;
            }
            if (c.length > (1u << 30)) return stbi__err("IDAT size limit", "IDAT section larger than 2^30 bytes");
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}